

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O3

Vec_Str_t * Wlc_StdinCollectProblem(char *pDir)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Vec_Str_t *pVVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  
  sVar3 = strlen(pDir);
  pVVar4 = (Vec_Str_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  pVVar4->pArray = pcVar5;
  iVar2 = fgetc(_stdin);
  if (iVar2 == -1) {
    uVar6 = 0;
  }
  else {
    iVar7 = (int)sVar3;
    do {
      uVar6 = pVVar4->nSize;
      if (uVar6 == pVVar4->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(0x10);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          sVar3 = (ulong)uVar6 * 2;
          if (pVVar4->pArray == (char *)0x0) {
            pcVar5 = (char *)malloc(sVar3);
          }
          else {
            pcVar5 = (char *)realloc(pVVar4->pArray,sVar3);
          }
          pVVar4->pArray = pcVar5;
          pVVar4->nCap = (int)sVar3;
        }
      }
      else {
        pcVar5 = pVVar4->pArray;
      }
      pVVar4->nSize = uVar6 + 1;
      pcVar5[(int)uVar6] = (char)iVar2;
      if ((iVar2 == 0x29) && (uVar6 = pVVar4->nSize, iVar7 <= (int)uVar6)) {
        iVar2 = strncmp(pVVar4->pArray + ((long)(int)uVar6 - (long)iVar7),pDir,(long)iVar7);
        if (iVar2 == 0) goto LAB_001ca972;
      }
      iVar2 = fgetc(_stdin);
    } while (iVar2 != -1);
    uVar6 = pVVar4->nSize;
LAB_001ca972:
    uVar1 = pVVar4->nCap;
    if (uVar6 == uVar1) {
      if ((int)uVar1 < 0x10) {
        if (pVVar4->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(pVVar4->pArray,0x10);
        }
        pVVar4->pArray = pcVar5;
        pVVar4->nCap = 0x10;
      }
      else {
        sVar3 = (ulong)uVar1 * 2;
        if (pVVar4->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar3);
        }
        else {
          pcVar5 = (char *)realloc(pVVar4->pArray,sVar3);
        }
        pVVar4->pArray = pcVar5;
        pVVar4->nCap = (int)sVar3;
      }
      goto LAB_001ca99c;
    }
  }
  pcVar5 = pVVar4->pArray;
LAB_001ca99c:
  pVVar4->nSize = uVar6 + 1;
  pcVar5[(int)uVar6] = '\0';
  return pVVar4;
}

Assistant:

Vec_Str_t * Wlc_StdinCollectProblem( char * pDir )
{
    int c, DirSize = strlen(pDir);
    Vec_Str_t * vInput = Vec_StrAlloc( 1000 );
    while ( (c = fgetc(stdin)) != EOF )
    {
        Vec_StrPush( vInput, (char)c );
        if ( c == ')' && Wlc_StdinCollectStop(vInput, pDir, DirSize) )
            break;
    }
    Vec_StrPush( vInput, '\0' );
    return vInput;
}